

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

ImRect __thiscall ImGuiWindow::TitleBarRect(ImGuiWindow *this)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  float fVar3;
  ImRect IVar4;
  float local_28;
  float local_18;
  float fStack_14;
  
  IVar2 = this->SizeFull;
  IVar1 = this->Pos;
  fVar3 = TitleBarHeight(this);
  local_28 = IVar2.x;
  local_18 = IVar1.x;
  fStack_14 = IVar1.y;
  IVar4.Max.x = local_18 + local_28;
  IVar4.Max.y = fStack_14 + fVar3;
  IVar4.Min = this->Pos;
  return IVar4;
}

Assistant:

ImRect      TitleBarRect() const                    { return ImRect(Pos, ImVec2(Pos.x + SizeFull.x, Pos.y + TitleBarHeight())); }